

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O2

void disguise_remove(CHAR_DATA *ch)

{
  char *pcVar1;
  
  free_pstring(ch->name);
  pcVar1 = palloc_string(ch->pcdata->old->name);
  ch->name = pcVar1;
  free_pstring(ch->short_descr);
  pcVar1 = palloc_string(ch->pcdata->old->short_descr);
  ch->short_descr = pcVar1;
  free_pstring(ch->long_descr);
  pcVar1 = palloc_string(ch->pcdata->old->long_descr);
  ch->long_descr = pcVar1;
  free_pstring(ch->description);
  pcVar1 = palloc_string(ch->pcdata->old->description);
  ch->description = pcVar1;
  free_oldchar(ch->pcdata->old);
  ch->pcdata->old = (OLD_CHAR *)0x0;
  return;
}

Assistant:

void disguise_remove(CHAR_DATA *ch)
{
	free_pstring(ch->name);
	ch->name = palloc_string(ch->pcdata->old->name);

	free_pstring(ch->short_descr);
	ch->short_descr = palloc_string(ch->pcdata->old->short_descr);

	free_pstring(ch->long_descr);
	ch->long_descr = palloc_string(ch->pcdata->old->long_descr);

	free_pstring(ch->description);
	ch->description = palloc_string(ch->pcdata->old->description);

	free_oldchar(ch->pcdata->old);
	ch->pcdata->old = nullptr;
}